

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printMemOffset(MCInst *MI,uint Op,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint uVar3;
  MCInst *MI_00;
  MCOperand *op;
  uint8_t *puVar4;
  uint in_ESI;
  MCInst *in_RDI;
  int64_t imm;
  uint8_t access [6];
  int reg;
  MCOperand *SegReg;
  MCOperand *DispSpec;
  cs_struct *in_stack_ffffffffffffffb8;
  SStream *in_stack_ffffffffffffffc0;
  SStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  MI_00 = (MCInst *)MCInst_getOperand(in_RDI,in_ESI);
  op = MCInst_getOperand(in_RDI,in_ESI + 1);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar4[0] = '\x03';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = in_RDI->x86opsize;
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x61;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x65;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x69;
    puVar4[0] = '\x01';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    in_stack_ffffffffffffffb8 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    get_op_access((cs_struct *)MI_00,(uint)((ulong)op >> 0x20),
                  (uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (uint64_t *)in_stack_ffffffffffffffc8);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
         (&stack0xffffffffffffffce)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
  }
  uVar3 = MCOperand_getReg(op);
  if (uVar3 != 0) {
    _printOperand(MI_00,(uint)((ulong)op >> 0x20),
                  (SStream *)CONCAT44(uVar3,in_stack_ffffffffffffffd0));
    SStream_concat0(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = uVar3;
    }
  }
  SStream_concat0(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  _Var2 = MCOperand_isImm((MCOperand *)MI_00);
  if (_Var2) {
    in_stack_ffffffffffffffc0 = (SStream *)MCOperand_getImm((MCOperand *)MI_00);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(SStream **)
       (in_RDI->flat_insn->detail->groups +
       (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d) =
           in_stack_ffffffffffffffc0;
    }
    _Var2 = SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0);
    if ((long)in_stack_ffffffffffffffc0 < 0) {
      printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (int64_t)in_stack_ffffffffffffffc0,_Var2);
    }
    else {
      printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (int64_t)in_stack_ffffffffffffffc0,_Var2);
    }
  }
  SStream_concat0(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  if (in_RDI->op1_size == '\0') {
    in_RDI->op1_size = in_RDI->x86opsize;
  }
  return;
}

Assistant:

static void printMemOffset(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *DispSpec = MCInst_getOperand(MI, Op);
	MCOperand *SegReg = MCInst_getOperand(MI, Op+1);
	int reg;

	if (MI->csh->detail) {
		uint8_t access[6];

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
	}

	// If this has a segment register, print it.
	reg = MCOperand_getReg(SegReg);
	if (reg) {
		_printOperand(MI, Op + 1, O);
		SStream_concat0(O, ":");
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = reg;
		}
	}

	if (MCOperand_isImm(DispSpec)) {
		int64_t imm = MCOperand_getImm(DispSpec);
		if (MI->csh->detail)
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, arch_masks[MI->csh->mode] & imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->x86.op_count++;
}